

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshrec.c
# Opt level: O1

void ps_hints_t1reset(PS_Hints hints,FT_UInt end_point)

{
  FT_Memory memory;
  FT_Error FVar1;
  ulong uVar2;
  bool bVar3;
  PS_Mask mask;
  PS_Mask local_20;
  
  if (hints->error != 0) {
    return;
  }
  if (hints->hint_type == PS_HINT_TYPE_1) {
    memory = hints->memory;
    uVar2 = (ulong)hints->dimension[0].masks.num_masks;
    if (uVar2 != 0) {
      hints->dimension[0].masks.masks[uVar2 - 1].end_point = end_point;
    }
    FVar1 = ps_mask_table_alloc(&hints->dimension[0].masks,memory,&local_20);
    if (FVar1 == 0) {
      uVar2 = (ulong)hints->dimension[1].masks.num_masks;
      if (uVar2 != 0) {
        hints->dimension[1].masks.masks[uVar2 - 1].end_point = end_point;
      }
      FVar1 = ps_mask_table_alloc(&hints->dimension[1].masks,memory,&local_20);
      bVar3 = FVar1 == 0;
      goto LAB_00158f40;
    }
  }
  else {
    FVar1 = 6;
  }
  bVar3 = false;
LAB_00158f40:
  if (!bVar3) {
    hints->error = FVar1;
  }
  return;
}

Assistant:

static void
  ps_hints_t1reset( PS_Hints  hints,
                    FT_UInt   end_point )
  {
    FT_Error  error = FT_Err_Ok;


    if ( !hints->error )
    {
      FT_Memory  memory = hints->memory;


      if ( hints->hint_type == PS_HINT_TYPE_1 )
      {
        error = ps_dimension_reset_mask( &hints->dimension[0],
                                         end_point, memory );
        if ( error )
          goto Fail;

        error = ps_dimension_reset_mask( &hints->dimension[1],
                                         end_point, memory );
        if ( error )
          goto Fail;
      }
      else
      {
        /* invalid hint type */
        error = FT_THROW( Invalid_Argument );
        goto Fail;
      }
    }
    return;

  Fail:
    hints->error = error;
  }